

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

void __thiscall
cmGeneratorTarget::GetTargetVersion
          (cmGeneratorTarget *this,string *property,int *major,int *minor,int *patch)

{
  TargetType TVar1;
  int iVar2;
  cmValue cVar3;
  int parsed_patch;
  int parsed_minor;
  int parsed_major;
  int local_34;
  int local_30;
  int local_2c;
  
  *major = 0;
  *minor = 0;
  *patch = 0;
  TVar1 = cmTarget::GetType(this->Target);
  if (TVar1 == INTERFACE_LIBRARY) {
    __assert_fail("this->GetType() != cmStateEnums::INTERFACE_LIBRARY",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorTarget.cxx"
                  ,0x195a,
                  "void cmGeneratorTarget::GetTargetVersion(const std::string &, int &, int &, int &) const"
                 );
  }
  cVar3 = GetProperty(this,property);
  if (cVar3.Value != (string *)0x0) {
    iVar2 = __isoc99_sscanf(((cVar3.Value)->_M_dataplus)._M_p,"%d.%d.%d",&local_2c,&local_30,
                            &local_34);
    if (iVar2 != 1) {
      if (iVar2 != 2) {
        if (iVar2 != 3) {
          return;
        }
        *patch = local_34;
      }
      *minor = local_30;
    }
    *major = local_2c;
  }
  return;
}

Assistant:

void cmGeneratorTarget::GetTargetVersion(const std::string& property,
                                         int& major, int& minor,
                                         int& patch) const
{
  // Set the default values.
  major = 0;
  minor = 0;
  patch = 0;

  assert(this->GetType() != cmStateEnums::INTERFACE_LIBRARY);

  if (cmValue version = this->GetProperty(property)) {
    // Try to parse the version number and store the results that were
    // successfully parsed.
    int parsed_major;
    int parsed_minor;
    int parsed_patch;
    switch (sscanf(version->c_str(), "%d.%d.%d", &parsed_major, &parsed_minor,
                   &parsed_patch)) {
      case 3:
        patch = parsed_patch;
        CM_FALLTHROUGH;
      case 2:
        minor = parsed_minor;
        CM_FALLTHROUGH;
      case 1:
        major = parsed_major;
        CM_FALLTHROUGH;
      default:
        break;
    }
  }
}